

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O1

bool Js::JavascriptRegExp::IsRegExpLike(Var aValue,ScriptContext *scriptContext)

{
  BOOL BVar1;
  RecyclableObject *instance;
  Var instance_00;
  bool bVar2;
  
  if (((scriptContext->config).threadConfig)->m_ES6RegExSymbols != true) {
LAB_00d13c30:
    bVar2 = VarIs<Js::JavascriptRegExp>(aValue);
    return bVar2;
  }
  BVar1 = JavascriptOperators::IsObject(aValue);
  if (BVar1 == 0) {
    bVar2 = false;
  }
  else {
    instance = VarTo<Js::RecyclableObject>(aValue);
    instance_00 = JavascriptOperators::GetProperty
                            (instance,0x15,scriptContext,(PropertyValueInfo *)0x0);
    BVar1 = JavascriptOperators::IsUndefined(instance_00);
    if (BVar1 != 0) goto LAB_00d13c30;
    BVar1 = JavascriptConversion::ToBoolean(instance_00,scriptContext);
    bVar2 = BVar1 != 0;
  }
  return bVar2;
}

Assistant:

bool JavascriptRegExp::IsRegExpLike(Var aValue, ScriptContext* scriptContext)
    {
        if (scriptContext->GetConfig()->IsES6RegExSymbolsEnabled())
        {
            if (!JavascriptOperators::IsObject(aValue))
            {
                return false;
            }

            Var symbolMatchProperty = JavascriptOperators::GetProperty(
                VarTo<RecyclableObject>(aValue),
                PropertyIds::_symbolMatch,
                scriptContext);
            if (!JavascriptOperators::IsUndefined(symbolMatchProperty))
            {
                return JavascriptConversion::ToBool(symbolMatchProperty, scriptContext);
            }
        }

        return VarIs<JavascriptRegExp>(aValue);
    }